

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateFromConnectionString
          (char *connectionString,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  _Bool use_dev_auth;
  bool bVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  IOTHUB_CLIENT_CONFIG *client_config;
  STRING_HANDLE handle;
  STRING_TOKENIZER_HANDLE tokenizer;
  char *pcVar4;
  LOGGER_LOG l_25;
  LOGGER_LOG l_24;
  LOGGER_LOG l_23;
  LOGGER_LOG l_22;
  LOGGER_LOG l_21;
  LOGGER_LOG l_20;
  LOGGER_LOG l_19;
  LOGGER_LOG l_18;
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  STRING_TOKENIZER_HANDLE tokenizer2;
  char *s_token;
  LOGGER_LOG l_9;
  _Bool use_provisioning;
  int isx509found;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  STRING_HANDLE moduleId;
  STRING_HANDLE protocolGateway;
  STRING_HANDLE deviceSasTokenString;
  STRING_HANDLE deviceKeyString;
  STRING_HANDLE deviceIdString;
  STRING_HANDLE hostSuffixString;
  STRING_HANDLE hostNameString;
  STRING_HANDLE valueString;
  STRING_HANDLE tokenString;
  STRING_HANDLE connString;
  STRING_TOKENIZER_HANDLE tokenizer1;
  LOGGER_LOG l_2;
  IOTHUB_CLIENT_CONFIG *config;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_CORE_LL_HANDLE result;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol_local;
  char *connectionString_local;
  
  if (connectionString == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x56c,1,
                "Input parameter is NULL: connectionString");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x571,1,
                "Input parameter is NULL: protocol");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    client_config = (IOTHUB_CLIENT_CONFIG *)malloc(0x38);
    if (client_config == (IOTHUB_CLIENT_CONFIG *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_CreateFromConnectionString",0x579,1,"Malloc failed");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      connString = (STRING_HANDLE)0x0;
      valueString = (STRING_HANDLE)0x0;
      hostNameString = (STRING_HANDLE)0x0;
      hostSuffixString = (STRING_HANDLE)0x0;
      deviceIdString = (STRING_HANDLE)0x0;
      deviceKeyString = (STRING_HANDLE)0x0;
      deviceSasTokenString = (STRING_HANDLE)0x0;
      protocolGateway = (STRING_HANDLE)0x0;
      moduleId = (STRING_HANDLE)0x0;
      l_3 = (LOGGER_LOG)0x0;
      memset(client_config,0,0x38);
      client_config->protocol = protocol;
      client_config->protocolGatewayHostName = (char *)0x0;
      handle = STRING_construct(connectionString);
      if (handle == (STRING_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_CreateFromConnectionString",0x591,1,
                    "Error constructing connection String");
        }
        l = (LOGGER_LOG)0x0;
      }
      else {
        connString = (STRING_HANDLE)STRING_TOKENIZER_create(handle);
        if ((STRING_TOKENIZER_HANDLE)connString == (STRING_TOKENIZER_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromConnectionString",0x596,1,
                      "Error creating Tokenizer");
          }
          l = (LOGGER_LOG)0x0;
        }
        else {
          valueString = STRING_new();
          if (valueString == (STRING_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromConnectionString",0x59b,1,
                        "Error creating Token String");
            }
            l = (LOGGER_LOG)0x0;
          }
          else {
            hostNameString = STRING_new();
            if (hostNameString == (STRING_HANDLE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                          ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5a0,1,
                          "Error creating Value String");
              }
              l = (LOGGER_LOG)0x0;
            }
            else {
              hostSuffixString = STRING_new();
              if (hostSuffixString == (STRING_HANDLE)0x0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5a5,1,
                            "Error creating HostName String");
                }
                l = (LOGGER_LOG)0x0;
              }
              else {
                deviceIdString = STRING_new();
                if (deviceIdString == (STRING_HANDLE)0x0) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                              ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5aa,1,
                              "Error creating HostSuffix String");
                  }
                  l = (LOGGER_LOG)0x0;
                }
                else {
                  bVar1 = false;
                  use_dev_auth = false;
                  do {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                while( true ) {
                                  while( true ) {
                                    do {
                                      iVar2 = STRING_TOKENIZER_get_next_token
                                                        ((STRING_TOKENIZER_HANDLE)connString,
                                                         valueString,"=");
                                      if (iVar2 != 0) goto LAB_00121df3;
                                      iVar2 = STRING_TOKENIZER_get_next_token
                                                        ((STRING_TOKENIZER_HANDLE)connString,
                                                         hostNameString,";");
                                      if (iVar2 != 0) {
                                        p_Var3 = xlogging_get_log_function();
                                        if (p_Var3 != (LOGGER_LOG)0x0) {
                                          (*p_Var3)(AZ_LOG_ERROR,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                                  ,"IoTHubClientCore_LL_CreateFromConnectionString",
                                                  0x5b5,1,"Tokenizer error");
                                        }
                                        goto LAB_00121df3;
                                      }
                                    } while (valueString == (STRING_HANDLE)0x0);
                                    pcVar4 = STRING_c_str(valueString);
                                    iVar2 = strcmp(pcVar4,"HostName");
                                    if (iVar2 != 0) break;
                                    tokenizer = STRING_TOKENIZER_create(hostNameString);
                                    if (tokenizer == (STRING_TOKENIZER_HANDLE)0x0) {
                                      p_Var3 = xlogging_get_log_function();
                                      if (p_Var3 != (LOGGER_LOG)0x0) {
                                        (*p_Var3)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                                  ,"IoTHubClientCore_LL_CreateFromConnectionString",
                                                  0x5c2,1,"Error creating Tokenizer");
                                      }
                                      goto LAB_00121df3;
                                    }
                                    iVar2 = STRING_TOKENIZER_get_next_token
                                                      (tokenizer,hostSuffixString,".");
                                    if (iVar2 != 0) {
                                      p_Var3 = xlogging_get_log_function();
                                      if (p_Var3 != (LOGGER_LOG)0x0) {
                                        (*p_Var3)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                                  ,"IoTHubClientCore_LL_CreateFromConnectionString",
                                                  0x5c9,1,"Tokenizer error");
                                      }
                                      STRING_TOKENIZER_destroy(tokenizer);
                                      goto LAB_00121df3;
                                    }
                                    pcVar4 = STRING_c_str(hostSuffixString);
                                    client_config->iotHubName = pcVar4;
                                    iVar2 = STRING_TOKENIZER_get_next_token
                                                      (tokenizer,deviceIdString,";");
                                    if (iVar2 != 0) {
                                      p_Var3 = xlogging_get_log_function();
                                      if (p_Var3 != (LOGGER_LOG)0x0) {
                                        (*p_Var3)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                                  ,"IoTHubClientCore_LL_CreateFromConnectionString",
                                                  0x5d2,1,"Tokenizer error");
                                      }
                                      STRING_TOKENIZER_destroy(tokenizer);
                                      goto LAB_00121df3;
                                    }
                                    pcVar4 = STRING_c_str(deviceIdString);
                                    client_config->iotHubSuffix = pcVar4;
                                    STRING_TOKENIZER_destroy(tokenizer);
                                  }
                                  iVar2 = strcmp(pcVar4,"DeviceId");
                                  if (iVar2 != 0) break;
                                  deviceKeyString = STRING_clone(hostNameString);
                                  if (deviceKeyString == (STRING_HANDLE)0x0) {
                                    p_Var3 = xlogging_get_log_function();
                                    if (p_Var3 != (LOGGER_LOG)0x0) {
                                      (*p_Var3)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                                ,"IoTHubClientCore_LL_CreateFromConnectionString",
                                                0x5e7,1,"Failure cloning device id string");
                                    }
                                    goto LAB_00121df3;
                                  }
                                  pcVar4 = STRING_c_str(deviceKeyString);
                                  client_config->deviceId = pcVar4;
                                }
                                iVar2 = strcmp(pcVar4,"SharedAccessKey");
                                if (iVar2 != 0) break;
                                deviceSasTokenString = STRING_clone(hostNameString);
                                if (deviceSasTokenString == (STRING_HANDLE)0x0) {
                                  p_Var3 = xlogging_get_log_function();
                                  if (p_Var3 != (LOGGER_LOG)0x0) {
                                    (*p_Var3)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                              ,"IoTHubClientCore_LL_CreateFromConnectionString",
                                              0x5f4,1,"Failure cloning device key string");
                                  }
                                  goto LAB_00121df3;
                                }
                                pcVar4 = STRING_c_str(deviceSasTokenString);
                                client_config->deviceKey = pcVar4;
                              }
                              iVar2 = strcmp(pcVar4,"SharedAccessSignature");
                              if (iVar2 != 0) break;
                              protocolGateway = STRING_clone(hostNameString);
                              if (protocolGateway == (STRING_HANDLE)0x0) {
                                p_Var3 = xlogging_get_log_function();
                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                  (*p_Var3)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                            ,"IoTHubClientCore_LL_CreateFromConnectionString",0x601,
                                            1,"Failure cloning device sasToken string");
                                }
                                goto LAB_00121df3;
                              }
                              pcVar4 = STRING_c_str(protocolGateway);
                              client_config->deviceSasToken = pcVar4;
                            }
                            iVar2 = strcmp(pcVar4,"x509");
                            if (iVar2 != 0) break;
                            pcVar4 = STRING_c_str(hostNameString);
                            iVar2 = strcmp(pcVar4,"true");
                            if (iVar2 != 0) {
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                (*p_Var3)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                          ,"IoTHubClientCore_LL_CreateFromConnectionString",0x609,1,
                                          "x509 option has wrong value, the only acceptable one is \"true\""
                                         );
                              }
                              goto LAB_00121df3;
                            }
                            bVar1 = true;
                          }
                          iVar2 = strcmp(pcVar4,"UseProvisioning");
                          if (iVar2 != 0) break;
                          pcVar4 = STRING_c_str(hostNameString);
                          iVar2 = strcmp(pcVar4,"true");
                          if (iVar2 != 0) {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                        ,"IoTHubClientCore_LL_CreateFromConnectionString",0x615,1,
                                        "provisioning option has wrong value, the only acceptable one is \"true\""
                                       );
                            }
                            goto LAB_00121df3;
                          }
                          use_dev_auth = true;
                        }
                        iVar2 = strcmp(pcVar4,"GatewayHostName");
                        if (iVar2 != 0) break;
                        moduleId = STRING_clone(hostNameString);
                        if (moduleId == (STRING_HANDLE)0x0) {
                          p_Var3 = xlogging_get_log_function();
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                      ,"IoTHubClientCore_LL_CreateFromConnectionString",0x627,1,
                                      "Failure cloning protocol Gateway Name");
                          }
                          goto LAB_00121df3;
                        }
                        pcVar4 = STRING_c_str(moduleId);
                        client_config->protocolGatewayHostName = pcVar4;
                      }
                      iVar2 = strcmp(pcVar4,"ModuleId");
                      if (iVar2 == 0) break;
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                  ,"IoTHubClientCore_LL_CreateFromConnectionString",0x637,1,
                                  "Unknown token <%s> in connection string.  Ignoring error and continuing to parse"
                                  ,pcVar4);
                      }
                    }
                    l_3 = (LOGGER_LOG)STRING_clone(hostNameString);
                  } while ((STRING_HANDLE)l_3 != (STRING_HANDLE)0x0);
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                              ,"IoTHubClientCore_LL_CreateFromConnectionString",0x630,1,
                              "Failure cloning moduleId string");
                  }
LAB_00121df3:
                  if (client_config->iotHubName == (char *)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x63f,1,
                                "iotHubName is not found");
                    }
                    l = (LOGGER_LOG)0x0;
                  }
                  else if (client_config->iotHubSuffix == (char *)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x644,1,
                                "iotHubSuffix is not found");
                    }
                    l = (LOGGER_LOG)0x0;
                  }
                  else if (client_config->deviceId == (char *)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x649,1,
                                "deviceId is not found");
                    }
                    l = (LOGGER_LOG)0x0;
                  }
                  else if ((((use_dev_auth == false) && (!bVar1)) &&
                           ((client_config->deviceSasToken == (char *)0x0) !=
                            (client_config->deviceKey == (char *)0x0))) ||
                          (((use_dev_auth != false || (bVar1)) &&
                           ((client_config->deviceSasToken == (char *)0x0 &&
                            (client_config->deviceKey == (char *)0x0)))))) {
                    pcVar4 = STRING_c_str((STRING_HANDLE)l_3);
                    l = (LOGGER_LOG)
                        initialize_iothub_client
                                  (client_config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,use_dev_auth,
                                   pcVar4);
                    if (((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l ==
                         (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) &&
                       (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x659,1,
                                "IoTHubClientCore_LL_Create failed");
                    }
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x651,1,
                                "invalid combination of x509, provisioning, deviceSasToken and deviceKey"
                               );
                    }
                    l = (LOGGER_LOG)0x0;
                  }
                }
              }
            }
          }
        }
      }
      if (protocolGateway != (STRING_HANDLE)0x0) {
        STRING_delete(protocolGateway);
      }
      if (deviceSasTokenString != (STRING_HANDLE)0x0) {
        STRING_delete(deviceSasTokenString);
      }
      if (deviceKeyString != (STRING_HANDLE)0x0) {
        STRING_delete(deviceKeyString);
      }
      if (deviceIdString != (STRING_HANDLE)0x0) {
        STRING_delete(deviceIdString);
      }
      if (hostSuffixString != (STRING_HANDLE)0x0) {
        STRING_delete(hostSuffixString);
      }
      if (hostNameString != (STRING_HANDLE)0x0) {
        STRING_delete(hostNameString);
      }
      if (valueString != (STRING_HANDLE)0x0) {
        STRING_delete(valueString);
      }
      if (handle != (STRING_HANDLE)0x0) {
        STRING_delete(handle);
      }
      if (moduleId != (STRING_HANDLE)0x0) {
        STRING_delete(moduleId);
      }
      if (l_3 != (LOGGER_LOG)0x0) {
        STRING_delete((STRING_HANDLE)l_3);
      }
      if (connString != (STRING_HANDLE)0x0) {
        STRING_TOKENIZER_destroy((STRING_TOKENIZER_HANDLE)connString);
      }
      free(client_config);
    }
  }
  return (IOTHUB_CLIENT_CORE_LL_HANDLE)l;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateFromConnectionString(const char* connectionString, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;

    if (connectionString == NULL)
    {
        LogError("Input parameter is NULL: connectionString");
        result = NULL;
    }
    else if (protocol == NULL)
    {
        LogError("Input parameter is NULL: protocol");
        result = NULL;
    }
    else
    {
        IOTHUB_CLIENT_CONFIG* config = (IOTHUB_CLIENT_CONFIG*) malloc(sizeof(IOTHUB_CLIENT_CONFIG));
        if (config == NULL)
        {
            LogError("Malloc failed");
            result = NULL;
        }
        else
        {
            STRING_TOKENIZER_HANDLE tokenizer1 = NULL;
            STRING_HANDLE connString = NULL;
            STRING_HANDLE tokenString = NULL;
            STRING_HANDLE valueString = NULL;
            STRING_HANDLE hostNameString = NULL;
            STRING_HANDLE hostSuffixString = NULL;
            STRING_HANDLE deviceIdString = NULL;
            STRING_HANDLE deviceKeyString = NULL;
            STRING_HANDLE deviceSasTokenString = NULL;
            STRING_HANDLE protocolGateway = NULL;
            STRING_HANDLE moduleId = NULL;

            memset(config, 0, sizeof(*config));
            config->protocol = protocol;

            config->protocolGatewayHostName = NULL;

            if ((connString = STRING_construct(connectionString)) == NULL)
            {
                LogError("Error constructing connection String");
                result = NULL;
            }
            else if ((tokenizer1 = STRING_TOKENIZER_create(connString)) == NULL)
            {
                LogError("Error creating Tokenizer");
                result = NULL;
            }
            else if ((tokenString = STRING_new()) == NULL)
            {
                LogError("Error creating Token String");
                result = NULL;
            }
            else if ((valueString = STRING_new()) == NULL)
            {
                LogError("Error creating Value String");
                result = NULL;
            }
            else if ((hostNameString = STRING_new()) == NULL)
            {
                LogError("Error creating HostName String");
                result = NULL;
            }
            else if ((hostSuffixString = STRING_new()) == NULL)
            {
                LogError("Error creating HostSuffix String");
                result = NULL;
            }
            else
            {
                int isx509found = 0;
                bool use_provisioning = false;
                while ((STRING_TOKENIZER_get_next_token(tokenizer1, tokenString, "=") == 0))
                {
                    if (STRING_TOKENIZER_get_next_token(tokenizer1, valueString, ";") != 0)
                    {
                        LogError("Tokenizer error");
                        break;
                    }
                    else
                    {
                        if (tokenString != NULL)
                        {
                            const char* s_token = STRING_c_str(tokenString);
                            if (strcmp(s_token, HOSTNAME_TOKEN) == 0)
                            {
                                STRING_TOKENIZER_HANDLE tokenizer2 = NULL;
                                if ((tokenizer2 = STRING_TOKENIZER_create(valueString)) == NULL)
                                {
                                    LogError("Error creating Tokenizer");
                                    break;
                                }
                                else
                                {
                                    if (STRING_TOKENIZER_get_next_token(tokenizer2, hostNameString, ".") != 0)
                                    {
                                        LogError("Tokenizer error");
                                        STRING_TOKENIZER_destroy(tokenizer2);
                                        break;
                                    }
                                    else
                                    {
                                        config->iotHubName = STRING_c_str(hostNameString);
                                        if (STRING_TOKENIZER_get_next_token(tokenizer2, hostSuffixString, ";") != 0)
                                        {
                                            LogError("Tokenizer error");
                                            STRING_TOKENIZER_destroy(tokenizer2);
                                            break;
                                        }
                                        else
                                        {
                                            config->iotHubSuffix = STRING_c_str(hostSuffixString);
                                        }
                                    }
                                    STRING_TOKENIZER_destroy(tokenizer2);
                                }
                            }
                            else if (strcmp(s_token, DEVICEID_TOKEN) == 0)
                            {
                                deviceIdString = STRING_clone(valueString);
                                if (deviceIdString != NULL)
                                {
                                    config->deviceId = STRING_c_str(deviceIdString);
                                }
                                else
                                {
                                    LogError("Failure cloning device id string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, DEVICEKEY_TOKEN) == 0)
                            {
                                deviceKeyString = STRING_clone(valueString);
                                if (deviceKeyString != NULL)
                                {
                                    config->deviceKey = STRING_c_str(deviceKeyString);
                                }
                                else
                                {
                                    LogError("Failure cloning device key string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, DEVICESAS_TOKEN) == 0)
                            {
                                deviceSasTokenString = STRING_clone(valueString);
                                if (deviceSasTokenString != NULL)
                                {
                                    config->deviceSasToken = STRING_c_str(deviceSasTokenString);
                                }
                                else
                                {
                                    LogError("Failure cloning device sasToken string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, X509_TOKEN) == 0)
                            {
                                if (strcmp(STRING_c_str(valueString), X509_TOKEN_ONLY_ACCEPTABLE_VALUE) != 0)
                                {
                                    LogError("x509 option has wrong value, the only acceptable one is \"true\"");
                                    break;
                                }
                                else
                                {
                                    isx509found = 1;
                                }
                            }
                            else if (strcmp(s_token, PROVISIONING_TOKEN) == 0)
                            {
                                if (strcmp(STRING_c_str(valueString), PROVISIONING_ACCEPTABLE_VALUE) != 0)
                                {
                                    LogError("provisioning option has wrong value, the only acceptable one is \"true\"");
                                    break;
                                }
                                else
                                {
                                    use_provisioning = 1;
                                }
                            }

                            else if (strcmp(s_token, PROTOCOL_GATEWAY_HOST_TOKEN) == 0)
                            {
                                protocolGateway = STRING_clone(valueString);
                                if (protocolGateway != NULL)
                                {
                                    config->protocolGatewayHostName = STRING_c_str(protocolGateway);
                                }
                                else
                                {
                                    LogError("Failure cloning protocol Gateway Name");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, MODULE_ID_TOKEN) == 0)
                            {
                                moduleId = STRING_clone(valueString);
                                if (moduleId == NULL)
                                {
                                    LogError("Failure cloning moduleId string");
                                    break;
                                }
                            }
                            else
                            {
                                // If we get an unknown token, log it to error stream but do not cause a fatal error.
                                LogError("Unknown token <%s> in connection string.  Ignoring error and continuing to parse", s_token);
                            }
                        }
                    }
                }
                /* parsing is done - check the result */
                if (config->iotHubName == NULL)
                {
                    LogError("iotHubName is not found");
                    result = NULL;
                }
                else if (config->iotHubSuffix == NULL)
                {
                    LogError("iotHubSuffix is not found");
                    result = NULL;
                }
                else if (config->deviceId == NULL)
                {
                    LogError("deviceId is not found");
                    result = NULL;
                }
                else if (!(
                    ((!use_provisioning && !isx509found) && (config->deviceSasToken == NULL) ^ (config->deviceKey == NULL)) ||
                    ((use_provisioning || isx509found) && (config->deviceSasToken == NULL) && (config->deviceKey == NULL))
                    ))
                {
                    LogError("invalid combination of x509, provisioning, deviceSasToken and deviceKey");
                    result = NULL;
                }
                else
                {
                    result = initialize_iothub_client(config, NULL, use_provisioning, STRING_c_str(moduleId));
                    if (result == NULL)
                    {
                        LogError("IoTHubClientCore_LL_Create failed");
                    }
                    else
                    {
                        /*return as is*/
                    }
                }
            }
            if (deviceSasTokenString != NULL)
                STRING_delete(deviceSasTokenString);
            if (deviceKeyString != NULL)
                STRING_delete(deviceKeyString);
            if (deviceIdString != NULL)
                STRING_delete(deviceIdString);
            if (hostSuffixString != NULL)
                STRING_delete(hostSuffixString);
            if (hostNameString != NULL)
                STRING_delete(hostNameString);
            if (valueString != NULL)
                STRING_delete(valueString);
            if (tokenString != NULL)
                STRING_delete(tokenString);
            if (connString != NULL)
                STRING_delete(connString);
            if (protocolGateway != NULL)
                STRING_delete(protocolGateway);
            if (moduleId != NULL)
                STRING_delete(moduleId);

            if (tokenizer1 != NULL)
                STRING_TOKENIZER_destroy(tokenizer1);

            free(config);
        }
    }
    return result;
}